

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.h
# Opt level: O2

ChLoadXYZnodeXYZnodeSpring * __thiscall
chrono::ChLoadXYZnodeXYZnodeSpring::Clone(ChLoadXYZnodeXYZnodeSpring *this)

{
  ChLoadXYZnodeXYZnodeSpring *this_00;
  
  this_00 = (ChLoadXYZnodeXYZnodeSpring *)::operator_new(0xa0);
  ChLoadXYZnodeXYZnodeSpring(this_00,this);
  return this_00;
}

Assistant:

virtual ChLoadXYZnodeXYZnodeSpring* Clone() const override { return new ChLoadXYZnodeXYZnodeSpring(*this); }